

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O1

string * __thiscall
duckdb::AddFieldInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,AddFieldInfo *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  NotImplementedException *this_00;
  string *result;
  string *text;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_63b5960 + 9);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo.field_0xa == '\x01') {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ParseInfo::QualifierToString
            (&local_58,&(this->super_AlterTableInfo).super_AlterInfo.catalog,
             &(this->super_AlterTableInfo).super_AlterInfo.schema,
             &(this->super_AlterTableInfo).super_AlterInfo.name);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
  ;
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (this->if_field_not_exists == true) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  psVar2 = (this->column_path).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (text = (this->column_path).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; text != psVar2; text = text + 1) {
    KeywordHelper::WriteOptionallyQuoted(&local_58,text,'\"',true);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"FIXME: column definition to string","");
  NotImplementedException::NotImplementedException(this_00,&local_58);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string AddFieldInfo::ToString() const {
	string result = "";
	result += "ALTER TABLE ";
	if (if_not_found == OnEntryNotFound::RETURN_NULL) {
		result += " IF EXISTS";
	}
	result += QualifierToString(catalog, schema, name);
	result += " ADD COLUMN";
	if (if_field_not_exists) {
		result += " IF NOT EXISTS";
	}
	for (auto &path : column_path) {
		result += KeywordHelper::WriteOptionallyQuoted(path);
		result += ".";
	}
	throw NotImplementedException("FIXME: column definition to string");
	result += ";";
	return result;
}